

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vmstd.hpp
# Opt level: O1

void __thiscall squall::VMStd::dofile(VMStd *this,SQChar *filename)

{
  HSQUIRRELVM v;
  SQInteger newtop;
  SQRESULT SVar1;
  runtime_error *this_00;
  keeper k;
  
  v = (this->super_VM).imp_.vm_;
  newtop = sq_gettop(v);
  sq_pushroottable((this->super_VM).imp_.vm_);
  SVar1 = sqstd_dofile((this->super_VM).imp_.vm_,filename,0,1);
  if (-1 < SVar1) {
    sq_settop(v,newtop);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"dofile failed");
  *(undefined ***)this_00 = &PTR__runtime_error_0013f2e8;
  __cxa_throw(this_00,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void dofile(const SQChar* filename) {
        keeper k(handle());
        sq_pushroottable(handle());
        if (!SQ_SUCCEEDED(sqstd_dofile(handle(), filename, 0, 1))) {
            throw squirrel_error("dofile failed");
        }
    }